

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

CURLcode Curl_xfer_write_resp(Curl_easy *data,char *buf,size_t blen,_Bool is_eos)

{
  undefined1 *puVar1;
  _func_CURLcode_Curl_easy_ptr_char_ptr_size_t__Bool *p_Var2;
  curl_trc_feat *pcVar3;
  CURLcode CVar4;
  
  p_Var2 = data->conn->handler->write_resp;
  if (p_Var2 == (_func_CURLcode_Curl_easy_ptr_char_ptr_size_t__Bool *)0x0) {
    CVar4 = CURLE_OK;
    if (blen != 0 || is_eos) {
      CVar4 = Curl_client_write(data,(uint)is_eos * 0x80 + 1,buf,blen);
    }
  }
  else {
    CVar4 = (*p_Var2)(data,buf,blen,is_eos);
  }
  if (is_eos && CVar4 == CURLE_OK) {
    puVar1 = &(data->req).field_0xd9;
    *puVar1 = *puVar1 | 0x18;
  }
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)))) &&
     (0 < Curl_trc_feat_write.log_level)) {
    Curl_trc_write(data,"xfer_write_resp(len=%zu, eos=%d) -> %d",blen,is_eos,(ulong)CVar4);
  }
  return CVar4;
}

Assistant:

CURLcode Curl_xfer_write_resp(struct Curl_easy *data,
                              const char *buf, size_t blen,
                              bool is_eos)
{
  CURLcode result = CURLE_OK;

  if(data->conn->handler->write_resp) {
    /* protocol handlers offering this function take full responsibility
     * for writing all received download data to the client. */
    result = data->conn->handler->write_resp(data, buf, blen, is_eos);
  }
  else {
    /* No special handling by protocol handler, write all received data
     * as BODY to the client. */
    if(blen || is_eos) {
      int cwtype = CLIENTWRITE_BODY;
      if(is_eos)
        cwtype |= CLIENTWRITE_EOS;
      result = Curl_client_write(data, cwtype, buf, blen);
    }
  }

  if(!result && is_eos) {
    /* If we wrote the EOS, we are definitely done */
    data->req.eos_written = TRUE;
    data->req.download_done = TRUE;
  }
  CURL_TRC_WRITE(data, "xfer_write_resp(len=%zu, eos=%d) -> %d",
                 blen, is_eos, result);
  return result;
}